

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passphrase.c
# Opt level: O2

char * lafe_readpassphrase(char *prompt,char *buf,size_t bufsiz)

{
  bool bVar1;
  sig_atomic_t sVar2;
  char *__buf;
  int __fd;
  int iVar3;
  __pid_t __pid;
  size_t __n;
  ssize_t sVar4;
  int *piVar5;
  long lVar6;
  uint uVar7;
  char *pcVar8;
  char ch;
  int local_6c8;
  int local_6c4;
  char *local_6c0;
  char *local_6b8;
  char *local_6b0;
  termios term;
  termios oterm;
  sigaction sa;
  sigaction savepipe;
  sigaction savettou;
  sigaction savettin;
  sigaction savetstp;
  sigaction saveterm;
  sigaction savequit;
  sigaction savehup;
  sigaction saveint;
  sigaction savealrm;
  
  local_6b0 = prompt;
  if (bufsiz == 0) {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
  }
  else {
    local_6c0 = buf + (bufsiz - 1);
    lVar6 = 0;
    pcVar8 = local_6c0;
    local_6b8 = buf;
    do {
      for (; lVar6 != 0x17; lVar6 = lVar6 + 1) {
        signo[lVar6] = 0;
      }
      __fd = open("/dev/tty",2);
      local_6c8 = __fd;
      if (__fd == -1) {
        __fd = 0;
        local_6c8 = 2;
      }
      if ((__fd == 0) || (iVar3 = tcgetattr(__fd,(termios *)&oterm), iVar3 != 0)) {
        term.c_iflag = 0;
        term.c_oflag = 0;
        term.c_cc[0x1f] = '\0';
        term._49_3_ = 0;
        term.c_ispeed = 0;
        term.c_ospeed = 0;
        term.c_cc[0xf] = '\0';
        term.c_cc[0x10] = '\0';
        term.c_cc[0x11] = '\0';
        term.c_cc[0x12] = '\0';
        term.c_cc[0x13] = '\0';
        term.c_cc[0x14] = '\0';
        term.c_cc[0x15] = '\0';
        term.c_cc[0x16] = '\0';
        term.c_cc[0x17] = '\0';
        term.c_cc[0x18] = '\0';
        term.c_cc[0x19] = '\0';
        term.c_cc[0x1a] = '\0';
        term.c_cc[0x1b] = '\0';
        term.c_cc[0x1c] = '\0';
        term.c_cc[0x1d] = '\0';
        term.c_cc[0x1e] = '\0';
        term.c_line = '\0';
        term.c_cc[0] = '\0';
        term.c_cc[1] = '\0';
        term.c_cc[2] = '\0';
        term.c_cc[3] = '\0';
        term.c_cc[4] = '\0';
        term.c_cc[5] = '\0';
        term.c_cc[6] = '\0';
        term.c_cc[7] = '\0';
        term.c_cc[8] = '\0';
        term.c_cc[9] = '\0';
        term.c_cc[10] = '\0';
        term.c_cc[0xb] = '\0';
        term.c_cc[0xc] = '\0';
        term.c_cc[0xd] = '\0';
        term.c_cc[0xe] = '\0';
        term.c_cflag = 0;
        term.c_lflag = 8;
        oterm.c_iflag = 0;
        oterm.c_oflag = 0;
        oterm.c_line = '\0';
        oterm.c_cc[0] = '\0';
        oterm.c_cc[1] = '\0';
        oterm.c_cc[2] = '\0';
        oterm.c_cc[3] = '\0';
        oterm.c_cc[4] = '\0';
        oterm.c_cc[5] = '\0';
        oterm.c_cc[6] = '\0';
        oterm.c_cc[7] = '\0';
        oterm.c_cc[8] = '\0';
        oterm.c_cc[9] = '\0';
        oterm.c_cc[10] = '\0';
        oterm.c_cc[0xb] = '\0';
        oterm.c_cc[0xc] = '\0';
        oterm.c_cc[0xd] = '\0';
        oterm.c_cc[0xe] = '\0';
        oterm.c_cc[0xf] = '\0';
        oterm.c_cc[0x10] = '\0';
        oterm.c_cc[0x11] = '\0';
        oterm.c_cc[0x12] = '\0';
        oterm.c_cc[0x13] = '\0';
        oterm.c_cc[0x14] = '\0';
        oterm.c_cc[0x15] = '\0';
        oterm.c_cc[0x16] = '\0';
        oterm.c_cc[0x17] = '\0';
        oterm.c_cc[0x18] = '\0';
        oterm.c_cc[0x19] = '\0';
        oterm.c_cc[0x1a] = '\0';
        oterm.c_cc[0x1b] = '\0';
        oterm.c_cc[0x1c] = '\0';
        oterm.c_cc[0x1d] = '\0';
        oterm.c_cc[0x1e] = '\0';
        oterm.c_cc[0x1f] = '\0';
        oterm._49_3_ = 0;
        oterm.c_ispeed = 0;
        oterm.c_ospeed = 0;
        oterm.c_cflag = 0;
        oterm.c_lflag = 8;
      }
      else {
        term.c_iflag = oterm.c_iflag;
        term.c_oflag = oterm.c_oflag;
        term.c_cc[0x1f] = oterm.c_cc[0x1f];
        term._49_3_ = oterm._49_3_;
        term.c_ispeed = oterm.c_ispeed;
        term.c_ospeed = oterm.c_ospeed;
        term.c_cc[0xf] = oterm.c_cc[0xf];
        term.c_cc[0x10] = oterm.c_cc[0x10];
        term.c_cc[0x11] = oterm.c_cc[0x11];
        term.c_cc[0x12] = oterm.c_cc[0x12];
        term.c_cc[0x13] = oterm.c_cc[0x13];
        term.c_cc[0x14] = oterm.c_cc[0x14];
        term.c_cc[0x15] = oterm.c_cc[0x15];
        term.c_cc[0x16] = oterm.c_cc[0x16];
        term.c_cc[0x17] = oterm.c_cc[0x17];
        term.c_cc[0x18] = oterm.c_cc[0x18];
        term.c_cc[0x19] = oterm.c_cc[0x19];
        term.c_cc[0x1a] = oterm.c_cc[0x1a];
        term.c_cc[0x1b] = oterm.c_cc[0x1b];
        term.c_cc[0x1c] = oterm.c_cc[0x1c];
        term.c_cc[0x1d] = oterm.c_cc[0x1d];
        term.c_cc[0x1e] = oterm.c_cc[0x1e];
        term.c_line = oterm.c_line;
        term.c_cc[0] = oterm.c_cc[0];
        term.c_cc[1] = oterm.c_cc[1];
        term.c_cc[2] = oterm.c_cc[2];
        term.c_cc[3] = oterm.c_cc[3];
        term.c_cc[4] = oterm.c_cc[4];
        term.c_cc[5] = oterm.c_cc[5];
        term.c_cc[6] = oterm.c_cc[6];
        term.c_cc[7] = oterm.c_cc[7];
        term.c_cc[8] = oterm.c_cc[8];
        term.c_cc[9] = oterm.c_cc[9];
        term.c_cc[10] = oterm.c_cc[10];
        term.c_cc[0xb] = oterm.c_cc[0xb];
        term.c_cc[0xc] = oterm.c_cc[0xc];
        term.c_cc[0xd] = oterm.c_cc[0xd];
        term.c_cc[0xe] = oterm.c_cc[0xe];
        term._8_8_ = oterm._8_8_ & 0xffffffb7ffffffff;
        tcsetattr(__fd,2,(termios *)&term);
      }
      sigemptyset((sigset_t *)&sa.sa_mask);
      sa.sa_flags = 0;
      sa.__sigaction_handler.sa_handler = handler;
      sigaction(0xe,(sigaction *)&sa,(sigaction *)&savealrm);
      sigaction(1,(sigaction *)&sa,(sigaction *)&savehup);
      sigaction(2,(sigaction *)&sa,(sigaction *)&saveint);
      sigaction(0xd,(sigaction *)&sa,(sigaction *)&savepipe);
      sigaction(3,(sigaction *)&sa,(sigaction *)&savequit);
      sigaction(0xf,(sigaction *)&sa,(sigaction *)&saveterm);
      sigaction(0x14,(sigaction *)&sa,(sigaction *)&savetstp);
      sigaction(0x15,(sigaction *)&sa,(sigaction *)&savettin);
      sigaction(0x16,(sigaction *)&sa,(sigaction *)&savettou);
      __buf = local_6b0;
      __n = strlen(local_6b0);
      write(local_6c8,__buf,__n);
      while (((sVar4 = read(__fd,&ch,1), sVar4 == 1 && (ch != '\n')) && (ch != '\r'))) {
        if (buf < pcVar8) {
          *buf = ch;
          buf = buf + 1;
        }
      }
      *buf = '\0';
      piVar5 = __errno_location();
      local_6c4 = *piVar5;
      if ((term._8_8_ & 0x800000000) == 0) {
        write(local_6c8,"\n",1);
      }
      iVar3 = bcmp(&term,&oterm,0x3c);
      sVar2 = signo[0x16];
      if (iVar3 != 0) {
        do {
          iVar3 = tcsetattr(__fd,2,(termios *)&oterm);
          if ((iVar3 != -1) || (*piVar5 != 4)) break;
        } while (signo[0x16] == 0);
      }
      signo[0x16] = sVar2;
      sigaction(0xe,(sigaction *)&savealrm,(sigaction *)0x0);
      sigaction(1,(sigaction *)&savehup,(sigaction *)0x0);
      sigaction(2,(sigaction *)&saveint,(sigaction *)0x0);
      sigaction(3,(sigaction *)&savequit,(sigaction *)0x0);
      sigaction(0xd,(sigaction *)&savepipe,(sigaction *)0x0);
      sigaction(0xf,(sigaction *)&saveterm,(sigaction *)0x0);
      sigaction(0x14,(sigaction *)&savetstp,(sigaction *)0x0);
      sigaction(0x15,(sigaction *)&savettin,(sigaction *)0x0);
      sigaction(0x16,(sigaction *)&savettou,(sigaction *)0x0);
      if (__fd != 0) {
        close(__fd);
      }
      uVar7 = 0xffffffec;
      bVar1 = false;
      for (lVar6 = 0; lVar6 != 0x5c; lVar6 = lVar6 + 4) {
        if (*(int *)((long)signo + lVar6) != 0) {
          __pid = getpid();
          kill(__pid,uVar7 + 0x14);
          if (uVar7 < 3) {
            bVar1 = true;
          }
        }
        uVar7 = uVar7 + 1;
      }
      lVar6 = 0;
      buf = local_6b8;
      pcVar8 = local_6c0;
    } while (bVar1);
    if (local_6c4 != 0) {
      *piVar5 = local_6c4;
    }
    if ((sVar4 != -1) && (local_6b8 != (char *)0x0)) {
      return local_6b8;
    }
  }
  if (*piVar5 == 4) {
    return (char *)0x0;
  }
  lafe_errc(1,*piVar5,"Couldn\'t read passphrase");
}

Assistant:

static char *
readpassphrase(const char *prompt, char *buf, size_t bufsiz, int flags)
{
	ssize_t nr;
	int input, output, save_errno, i, need_restart;
	char ch, *p, *end;
	struct termios term, oterm;
#ifdef HAVE_SIGACTION
	struct sigaction sa, savealrm, saveint, savehup, savequit, saveterm;
	struct sigaction savetstp, savettin, savettou, savepipe;
#endif

	/* I suppose we could alloc on demand in this case (XXX). */
	if (bufsiz == 0) {
		errno = EINVAL;
		return(NULL);
	}

restart:
	for (i = 0; i <= MAX_SIGNO; i++)
		signo[i] = 0;
	nr = -1;
	save_errno = 0;
	need_restart = 0;
	/*
	 * Read and write to /dev/tty if available.  If not, read from
	 * stdin and write to stderr unless a tty is required.
	 */
	if ((flags & RPP_STDIN) ||
	    (input = output = open(_PATH_TTY, O_RDWR)) == -1) {
		if (flags & RPP_REQUIRE_TTY) {
			errno = ENOTTY;
			return(NULL);
		}
		input = STDIN_FILENO;
		output = STDERR_FILENO;
	}

	/*
	 * Turn off echo if possible.
	 * If we are using a tty but are not the foreground pgrp this will
	 * generate SIGTTOU, so do it *before* installing the signal handlers.
	 */
	if (input != STDIN_FILENO && tcgetattr(input, &oterm) == 0) {
		memcpy(&term, &oterm, sizeof(term));
		if (!(flags & RPP_ECHO_ON))
			term.c_lflag &= ~(ECHO | ECHONL);
#ifdef VSTATUS
		if (term.c_cc[VSTATUS] != _POSIX_VDISABLE)
			term.c_cc[VSTATUS] = _POSIX_VDISABLE;
#endif
		(void)tcsetattr(input, _T_FLUSH, &term);
	} else {
		memset(&term, 0, sizeof(term));
		term.c_lflag |= ECHO;
		memset(&oterm, 0, sizeof(oterm));
		oterm.c_lflag |= ECHO;
	}

#ifdef HAVE_SIGACTION
	/*
	 * Catch signals that would otherwise cause the user to end
	 * up with echo turned off in the shell.  Don't worry about
	 * things like SIGXCPU and SIGVTALRM for now.
	 */
	sigemptyset(&sa.sa_mask);
	sa.sa_flags = 0;		/* don't restart system calls */
	sa.sa_handler = handler;
	/* Keep this list in sync with MAX_SIGNO! */
	(void)sigaction(SIGALRM, &sa, &savealrm);
	(void)sigaction(SIGHUP, &sa, &savehup);
	(void)sigaction(SIGINT, &sa, &saveint);
	(void)sigaction(SIGPIPE, &sa, &savepipe);
	(void)sigaction(SIGQUIT, &sa, &savequit);
	(void)sigaction(SIGTERM, &sa, &saveterm);
	(void)sigaction(SIGTSTP, &sa, &savetstp);
	(void)sigaction(SIGTTIN, &sa, &savettin);
	(void)sigaction(SIGTTOU, &sa, &savettou);
#endif

	if (!(flags & RPP_STDIN)) {
		int r = write(output, prompt, strlen(prompt));
		(void)r;
	}
	end = buf + bufsiz - 1;
	p = buf;
	while ((nr = read(input, &ch, 1)) == 1 && ch != '\n' && ch != '\r') {
		if (p < end) {
			if ((flags & RPP_SEVENBIT))
				ch &= 0x7f;
			if (isalpha((unsigned char)ch)) {
				if ((flags & RPP_FORCELOWER))
					ch = (char)tolower((unsigned char)ch);
				if ((flags & RPP_FORCEUPPER))
					ch = (char)toupper((unsigned char)ch);
			}
			*p++ = ch;
		}
	}
	*p = '\0';
	save_errno = errno;
	if (!(term.c_lflag & ECHO)) {
		int r = write(output, "\n", 1);
		(void)r;
	}

	/* Restore old terminal settings and signals. */
	if (memcmp(&term, &oterm, sizeof(term)) != 0) {
		const int sigttou = signo[SIGTTOU];

		/* Ignore SIGTTOU generated when we are not the fg pgrp. */
		while (tcsetattr(input, _T_FLUSH, &oterm) == -1 &&
		    errno == EINTR && !signo[SIGTTOU])
			continue;
		signo[SIGTTOU] = sigttou;
	}
#ifdef HAVE_SIGACTION
	(void)sigaction(SIGALRM, &savealrm, NULL);
	(void)sigaction(SIGHUP, &savehup, NULL);
	(void)sigaction(SIGINT, &saveint, NULL);
	(void)sigaction(SIGQUIT, &savequit, NULL);
	(void)sigaction(SIGPIPE, &savepipe, NULL);
	(void)sigaction(SIGTERM, &saveterm, NULL);
	(void)sigaction(SIGTSTP, &savetstp, NULL);
	(void)sigaction(SIGTTIN, &savettin, NULL);
	(void)sigaction(SIGTTOU, &savettou, NULL);
#endif
	if (input != STDIN_FILENO)
		(void)close(input);

	/*
	 * If we were interrupted by a signal, resend it to ourselves
	 * now that we have restored the signal handlers.
	 */
	for (i = 0; i <= MAX_SIGNO; i++) {
		if (signo[i]) {
			kill(getpid(), i);
			switch (i) {
			case SIGTSTP:
			case SIGTTIN:
			case SIGTTOU:
				need_restart = 1;
			}
		}
	}
	if (need_restart)
		goto restart;

	if (save_errno)
		errno = save_errno;
	return(nr == -1 ? NULL : buf);
}